

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Cluster::PreWriteBlock(Cluster *this)

{
  bool bVar1;
  
  if (this->finalized_ != false) {
    return false;
  }
  if ((this->header_written_ == false) && (bVar1 = WriteClusterHeader(this), !bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool Cluster::PreWriteBlock() {
  if (finalized_)
    return false;

  if (!header_written_) {
    if (!WriteClusterHeader())
      return false;
  }

  return true;
}